

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::JsonUnitTestResultPrinter::JsonUnitTestResultPrinter
          (JsonUnitTestResultPrinter *this,char *output_file)

{
  ulong uVar1;
  ostream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  undefined8 *in_RDI;
  int in_stack_0000001c;
  char *in_stack_00000020;
  GTestLogSeverity in_stack_0000002c;
  GTestLog *in_stack_00000030;
  EmptyTestEventListener *in_stack_ffffffffffffffb0;
  GTestLog local_28 [2];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  EmptyTestEventListener::EmptyTestEventListener(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__JsonUnitTestResultPrinter_001f63f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    GTestLog::GTestLog(in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c);
    this_00 = GTestLog::GetStream(local_28);
    std::operator<<(this_00,"JSON output file may not be null");
    GTestLog::~GTestLog((GTestLog *)this_00);
  }
  return;
}

Assistant:

JsonUnitTestResultPrinter::JsonUnitTestResultPrinter(const char* output_file)
    : output_file_(output_file) {
  if (output_file_.empty()) {
    GTEST_LOG_(FATAL) << "JSON output file may not be null";
  }
}